

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

void __thiscall
QEasingCurve::addTCBSegment(QEasingCurve *this,QPointF *nextPoint,qreal t,qreal c,qreal b)

{
  QPointF point;
  bool bVar1;
  QEasingCurveFunction *pQVar2;
  rvalue_ref t_00;
  QPointF *in_RSI;
  TCBPoint *in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  qreal in_XMM2_Qa;
  TCBPoints *in_stack_00000130;
  QList<TCBPoint> *in_stack_ffffffffffffff60;
  Type in_stack_ffffffffffffff9c;
  QPointF local_50;
  qreal local_40;
  qreal local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)(in_RDI->_point).xp + 8) == 0) {
    pQVar2 = curveToFunctionObject(in_stack_ffffffffffffff9c);
    *(QEasingCurveFunction **)((long)(in_RDI->_point).xp + 8) = pQVar2;
  }
  t_00 = (rvalue_ref)(*(long *)((long)(in_RDI->_point).xp + 8) + 0x40);
  local_40 = in_RSI->xp;
  local_38 = in_RSI->yp;
  point.yp = in_XMM1_Qa;
  point.xp = in_XMM2_Qa;
  TCBPoint::TCBPoint(in_RDI,point,(qreal)in_stack_ffffffffffffff60,(qreal)t_00,3.65547511408696e-317
                    );
  QList<TCBPoint>::append(in_stack_ffffffffffffff60,t_00);
  QPointF::QPointF(&local_50,1.0,1.0);
  bVar1 = ::operator==(in_RSI,&t_00->_point);
  if (bVar1) {
    tcbToBezier(in_stack_00000130);
    QList<QPointF>::operator=((QList<QPointF> *)in_RSI,(QList<QPointF> *)t_00);
    QList<QPointF>::~QList((QList<QPointF> *)0x70e5ec);
    QList<TCBPoint>::clear((QList<TCBPoint> *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEasingCurve::addTCBSegment(const QPointF &nextPoint, qreal t, qreal c, qreal b)
{
    if (!d_ptr->config)
        d_ptr->config = curveToFunctionObject(d_ptr->type);

    d_ptr->config->_tcbPoints.append(TCBPoint(nextPoint, t, c, b));

    if (nextPoint == QPointF(1.0, 1.0)) {
        d_ptr->config->_bezierCurves = tcbToBezier(d_ptr->config->_tcbPoints);
        d_ptr->config->_tcbPoints.clear();
    }

}